

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

uint8_t read_cfl_alphas(FRAME_CONTEXT *ec_ctx,aom_reader *r,int8_t *signs_out)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *in_RDX;
  long in_RDI;
  aom_cdf_prob *cdf_v;
  aom_cdf_prob *cdf_u;
  uint8_t idx;
  int8_t joint_sign;
  aom_cdf_prob *in_stack_ffffffffffffffc8;
  aom_reader *in_stack_ffffffffffffffd0;
  undefined1 local_1a;
  
  iVar2 = aom_read_symbol_(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  cVar1 = (char)iVar2;
  local_1a = '\0';
  if ((cVar1 + 1) * 0xb >> 5 != 0) {
    uVar3 = aom_read_symbol_(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    local_1a = (uint8_t)((uVar3 & 0xff) << 4);
  }
  if (cVar1 + 1 + ((cVar1 + 1) * 0xb >> 5) * -3 != 0) {
    iVar2 = aom_read_symbol_((aom_reader *)
                             (in_RDI + 0x522c +
                             (long)((cVar1 + 1 + ((cVar1 + 1) * 0xb >> 5) * -3) * 3 +
                                    ((cVar1 + 1) * 0xb >> 5) + -3) * 0x22),in_stack_ffffffffffffffc8
                             ,0);
    local_1a = local_1a + (char)iVar2;
  }
  *in_RDX = cVar1;
  return local_1a;
}

Assistant:

static uint8_t read_cfl_alphas(FRAME_CONTEXT *const ec_ctx, aom_reader *r,
                               int8_t *signs_out) {
  const int8_t joint_sign =
      aom_read_symbol(r, ec_ctx->cfl_sign_cdf, CFL_JOINT_SIGNS, "cfl:signs");
  uint8_t idx = 0;
  // Magnitudes are only coded for nonzero values
  if (CFL_SIGN_U(joint_sign) != CFL_SIGN_ZERO) {
    aom_cdf_prob *cdf_u = ec_ctx->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];
    idx = (uint8_t)aom_read_symbol(r, cdf_u, CFL_ALPHABET_SIZE, "cfl:alpha_u")
          << CFL_ALPHABET_SIZE_LOG2;
  }
  if (CFL_SIGN_V(joint_sign) != CFL_SIGN_ZERO) {
    aom_cdf_prob *cdf_v = ec_ctx->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];
    idx += (uint8_t)aom_read_symbol(r, cdf_v, CFL_ALPHABET_SIZE, "cfl:alpha_v");
  }
  *signs_out = joint_sign;
  return idx;
}